

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
fmt::v5::internal::vformat<wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__)

{
  undefined **local_808;
  undefined1 *local_800;
  long lStack_7f8;
  undefined8 local_7f0;
  undefined1 local_7e8 [2000];
  
  lStack_7f8 = 0;
  local_808 = &PTR_grow_00182cf0;
  local_7f0 = 500;
  local_800 = local_7e8;
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_808);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)__return_storage_ptr__,local_800,local_800 + lStack_7f8 * 4);
  local_808 = &PTR_grow_00182cf0;
  if (local_800 != local_7e8) {
    operator_delete(local_800);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::basic_string<Char> internal::vformat(
    basic_string_view<Char> format_str,
    basic_format_args<typename buffer_context<Char>::type> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(buffer, format_str, args);
  return fmt::to_string(buffer);
}